

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# horizontalbitpacking.cpp
# Opt level: O2

void FastPForLib::simdhunpack(uint8_t *in,uint32_t *out,uint32_t bit)

{
  undefined1 (*pauVar1) [16];
  undefined8 *puVar2;
  uint8_t uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  long lVar8;
  undefined1 *puVar9;
  uint32_t j;
  int iVar10;
  long lVar11;
  logic_error *this;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  
  auVar5 = _DAT_00154420;
  auVar4 = _DAT_00154410;
  auVar31 = _DAT_001543f0;
  auVar37 = _DAT_001543e0;
  auVar40 = _DAT_001543d0;
  auVar32 = _DAT_001543c0;
  auVar17 = _DAT_001543b0;
  auVar34 = _DAT_001543a0;
  auVar39 = _DAT_00154380;
  auVar41 = _DAT_00154360;
  auVar50 = _DAT_00154350;
  auVar24 = _DAT_00154330;
  auVar43 = _DAT_00154310;
  auVar52 = _DAT_001542f0;
  auVar18 = _DAT_001542d0;
  auVar42 = _DAT_001542b0;
  auVar53 = _DAT_001542a0;
  auVar48 = _DAT_00154270;
  auVar47 = _DAT_00154250;
  auVar30 = _DAT_00154230;
  auVar12 = _DAT_00154220;
  auVar6 = _DAT_001541e0;
  switch(bit) {
  case 0:
    auVar49 = ZEXT1664((undefined1  [16])0x0);
    auVar44 = vmovdqu64_avx512f(auVar49);
    *(undefined1 (*) [64])(out + 0x70) = auVar44;
    auVar44 = vmovdqu64_avx512f(auVar49);
    *(undefined1 (*) [64])(out + 0x60) = auVar44;
    auVar44 = vmovdqu64_avx512f(auVar49);
    *(undefined1 (*) [64])(out + 0x50) = auVar44;
    auVar44 = vmovdqu64_avx512f(auVar49);
    *(undefined1 (*) [64])(out + 0x40) = auVar44;
    auVar44 = vmovdqu64_avx512f(auVar49);
    *(undefined1 (*) [64])(out + 0x30) = auVar44;
    auVar44 = vmovdqu64_avx512f(auVar49);
    *(undefined1 (*) [64])(out + 0x20) = auVar44;
    auVar44 = vmovdqu64_avx512f(auVar49);
    *(undefined1 (*) [64])(out + 0x10) = auVar44;
    auVar44 = vmovdqu64_avx512f(auVar49);
    *(undefined1 (*) [64])out = auVar44;
    break;
  case 1:
    auVar6 = vpmovsxbd_avx(ZEXT416(0x3020100));
    auVar16._8_8_ = 0x100000001;
    auVar16._0_8_ = 0x100000001;
    auVar12 = vpmovsxbd_avx(ZEXT416(0x7060504));
    lVar11 = 0;
    while (lVar11 != 0x10) {
      uVar3 = in[lVar11];
      auVar45[1] = uVar3;
      auVar45[0] = uVar3;
      auVar45[2] = uVar3;
      auVar45[3] = uVar3;
      auVar45[4] = uVar3;
      auVar45[5] = uVar3;
      auVar45[6] = uVar3;
      auVar45[7] = uVar3;
      auVar45[8] = uVar3;
      auVar45[9] = uVar3;
      auVar45[10] = uVar3;
      auVar45[0xb] = uVar3;
      auVar45[0xc] = uVar3;
      auVar45[0xd] = uVar3;
      auVar45[0xe] = uVar3;
      auVar45[0xf] = uVar3;
      auVar30 = vpsrlvd_avx2(auVar45,auVar6);
      auVar30 = vpand_avx(auVar30,auVar16);
      *(undefined1 (*) [16])out = auVar30;
      uVar3 = in[lVar11];
      auVar46[1] = uVar3;
      auVar46[0] = uVar3;
      auVar46[2] = uVar3;
      auVar46[3] = uVar3;
      auVar46[4] = uVar3;
      auVar46[5] = uVar3;
      auVar46[6] = uVar3;
      auVar46[7] = uVar3;
      auVar46[8] = uVar3;
      auVar46[9] = uVar3;
      auVar46[10] = uVar3;
      auVar46[0xb] = uVar3;
      auVar46[0xc] = uVar3;
      auVar46[0xd] = uVar3;
      auVar46[0xe] = uVar3;
      auVar46[0xf] = uVar3;
      lVar11 = lVar11 + 1;
      auVar30 = vpsrlvd_avx2(auVar46,auVar12);
      auVar30 = vpand_avx(auVar30,auVar16);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar30;
      out = (uint32_t *)((long)out + 0x20);
    }
    break;
  case 2:
    auVar6 = vpmovsxbd_avx(ZEXT416(0x6040200));
    auVar15._8_8_ = 0x300000003;
    auVar15._0_8_ = 0x300000003;
    lVar11 = 0;
    while (lVar11 != 0x10) {
      uVar3 = in[lVar11 * 2];
      auVar25[1] = uVar3;
      auVar25[0] = uVar3;
      auVar25[2] = uVar3;
      auVar25[3] = uVar3;
      auVar25[4] = uVar3;
      auVar25[5] = uVar3;
      auVar25[6] = uVar3;
      auVar25[7] = uVar3;
      auVar25[8] = uVar3;
      auVar25[9] = uVar3;
      auVar25[10] = uVar3;
      auVar25[0xb] = uVar3;
      auVar25[0xc] = uVar3;
      auVar25[0xd] = uVar3;
      auVar25[0xe] = uVar3;
      auVar25[0xf] = uVar3;
      auVar12 = vpsrlvd_avx2(auVar25,auVar6);
      auVar12 = vpand_avx(auVar12,auVar15);
      *(undefined1 (*) [16])out = auVar12;
      uVar3 = in[lVar11 * 2 + 1];
      auVar26[1] = uVar3;
      auVar26[0] = uVar3;
      auVar26[2] = uVar3;
      auVar26[3] = uVar3;
      auVar26[4] = uVar3;
      auVar26[5] = uVar3;
      auVar26[6] = uVar3;
      auVar26[7] = uVar3;
      auVar26[8] = uVar3;
      auVar26[9] = uVar3;
      auVar26[10] = uVar3;
      auVar26[0xb] = uVar3;
      auVar26[0xc] = uVar3;
      auVar26[0xd] = uVar3;
      auVar26[0xe] = uVar3;
      auVar26[0xf] = uVar3;
      lVar11 = lVar11 + 1;
      auVar12 = vpsrlvd_avx2(auVar26,auVar6);
      auVar12 = vpand_avx(auVar12,auVar15);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar12;
      out = (uint32_t *)((long)out + 0x20);
    }
    break;
  case 3:
    lVar11 = 1;
    auVar30 = vpmovzxwd_avx(ZEXT816(0x8001010080008000));
    auVar6 = vpmovsxbd_avx(ZEXT416(0x1060300));
    auVar28._8_8_ = 0x700000007;
    auVar28._0_8_ = 0x700000007;
    auVar47 = vpmovzxwd_avx(ZEXT816(0x8001800101008000));
    auVar12 = vpmovsxbd_avx(ZEXT416(0x5020704));
    while (lVar11 != 0x31) {
      auVar48 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar11 + -1),auVar30);
      auVar48 = vpsrlvd_avx2(auVar48,auVar6);
      auVar48 = vpand_avx(auVar48,auVar28);
      *(undefined1 (*) [16])out = auVar48;
      pauVar1 = (undefined1 (*) [16])(in + lVar11);
      lVar11 = lVar11 + 3;
      auVar48 = vpshufb_avx(*pauVar1,auVar47);
      auVar48 = vpsrlvd_avx2(auVar48,auVar12);
      auVar48 = vpand_avx(auVar48,auVar28);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar48;
      out = (uint32_t *)((long)out + 0x20);
    }
    break;
  case 4:
    auVar6 = vpmovsxbw_avx(ZEXT816(0x301030101000100));
    auVar13._8_8_ = 0x400000000;
    auVar13._0_8_ = 0x400000000;
    auVar21._8_8_ = 0xf0000000f;
    auVar21._0_8_ = 0xf0000000f;
    for (lVar11 = 0; lVar11 != 0x40; lVar11 = lVar11 + 4) {
      auVar12 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar11),auVar6);
      auVar12 = vpsrlvd_avx2(auVar12,auVar13);
      auVar12 = vpand_avx(auVar12,auVar21);
      *(undefined1 (*) [16])(out + lVar11 * 2) = auVar12;
      auVar12 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar11 + 2),auVar6);
      auVar12 = vpsrlvd_avx2(auVar12,auVar13);
      auVar12 = vpand_avx(auVar12,auVar21);
      *(undefined1 (*) [16])(out + lVar11 * 2 + 4) = auVar12;
    }
    break;
  case 5:
    lVar11 = 2;
    auVar30 = vpmovzxwd_avx(ZEXT816(0x201800101008000));
    auVar6 = vpmovsxbd_avx(ZEXT416(0x7020500));
    auVar33._8_8_ = 0x1f0000001f;
    auVar33._0_8_ = 0x1f0000001f;
    auVar47 = vpmovzxwd_avx(ZEXT816(0x8002020180010100));
    auVar12 = vpmovsxbd_avx(ZEXT416(0x3060104));
    while (lVar11 != 0x52) {
      auVar48 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar11 + -2),auVar30);
      auVar48 = vpsrlvd_avx2(auVar48,auVar6);
      auVar48 = vpand_avx(auVar48,auVar33);
      *(undefined1 (*) [16])out = auVar48;
      pauVar1 = (undefined1 (*) [16])(in + lVar11);
      lVar11 = lVar11 + 5;
      auVar48 = vpshufb_avx(*pauVar1,auVar47);
      auVar48 = vpsrlvd_avx2(auVar48,auVar12);
      auVar48 = vpand_avx(auVar48,auVar33);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar48;
      out = (uint32_t *)((long)out + 0x20);
    }
    break;
  case 6:
    auVar12 = vpmovzxwd_avx(ZEXT816(0x8002020101008000));
    auVar6 = vpmovsxbd_avx(ZEXT416(0x2040600));
    auVar36._8_8_ = 0x3f0000003f;
    auVar36._0_8_ = 0x3f0000003f;
    lVar11 = 0;
    while (lVar11 != 0x60) {
      auVar30 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar11),auVar12);
      auVar30 = vpsrlvd_avx2(auVar30,auVar6);
      auVar30 = vpand_avx(auVar30,auVar36);
      *(undefined1 (*) [16])out = auVar30;
      lVar8 = lVar11 + 3;
      lVar11 = lVar11 + 6;
      auVar30 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar8),auVar12);
      auVar30 = vpsrlvd_avx2(auVar30,auVar6);
      auVar30 = vpand_avx(auVar30,auVar36);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar30;
      out = (uint32_t *)((long)out + 0x20);
    }
    break;
  case 7:
    auVar30 = vpmovzxwd_avx(ZEXT816(0x302020101008000));
    auVar6 = vpmovsxbd_avx(ZEXT416(0x5060700));
    auVar29._8_8_ = 0x7f0000007f;
    auVar29._0_8_ = 0x7f0000007f;
    auVar47 = vpmovzxwd_avx(ZEXT816(0x8003030202010100));
    auVar12 = vpmovsxbd_avx(ZEXT416(0x1020304));
    lVar11 = 0;
    while (lVar11 != 0x70) {
      auVar48 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar11),auVar30);
      auVar48 = vpsrlvd_avx2(auVar48,auVar6);
      auVar48 = vpand_avx(auVar48,auVar29);
      *(undefined1 (*) [16])out = auVar48;
      lVar8 = lVar11 + 3;
      lVar11 = lVar11 + 7;
      auVar48 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar8),auVar47);
      auVar48 = vpsrlvd_avx2(auVar48,auVar12);
      auVar48 = vpand_avx(auVar48,auVar29);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar48;
      out = (uint32_t *)((long)out + 0x20);
    }
    break;
  case 8:
    for (lVar11 = 0; lVar11 != 0x80; lVar11 = lVar11 + 8) {
      auVar6 = vpmovzxbd_avx(ZEXT416(*(uint *)(in + lVar11)));
      *(undefined1 (*) [16])(out + lVar11) = auVar6;
      auVar6 = vpmovzxbd_avx(ZEXT416(*(uint *)(in + lVar11 + 4)));
      *(undefined1 (*) [16])(out + lVar11 + 4) = auVar6;
    }
    break;
  case 9:
    lVar11 = 4;
    auVar30 = vpmovsxwd_avx(ZEXT816(0x403030202010100));
    auVar6 = vpmovsxbd_avx(ZEXT416(0x3020100));
    auVar23._8_8_ = 0x1ff000001ff;
    auVar23._0_8_ = 0x1ff000001ff;
    auVar12 = vpmovsxbd_avx(ZEXT416(0x7060504));
    while (lVar11 != 0x94) {
      auVar47 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar11 + -4),auVar30);
      auVar47 = vpsrlvd_avx2(auVar47,auVar6);
      auVar47 = vpand_avx(auVar47,auVar23);
      *(undefined1 (*) [16])out = auVar47;
      pauVar1 = (undefined1 (*) [16])(in + lVar11);
      lVar11 = lVar11 + 9;
      auVar47 = vpshufb_avx(*pauVar1,auVar30);
      auVar47 = vpsrlvd_avx2(auVar47,auVar12);
      auVar47 = vpand_avx(auVar47,auVar23);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar47;
      out = (uint32_t *)((long)out + 0x20);
    }
    break;
  case 10:
    auVar12 = vpmovsxwd_avx(ZEXT816(0x403030202010100));
    auVar6 = vpmovsxbd_avx(ZEXT416(0x6040200));
    auVar38._8_8_ = 0x3ff000003ff;
    auVar38._0_8_ = 0x3ff000003ff;
    lVar11 = 0;
    while (lVar11 != 0xa0) {
      auVar30 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar11),auVar12);
      auVar30 = vpsrlvd_avx2(auVar30,auVar6);
      auVar30 = vpand_avx(auVar30,auVar38);
      *(undefined1 (*) [16])out = auVar30;
      lVar8 = lVar11 + 5;
      lVar11 = lVar11 + 10;
      auVar30 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar8),auVar12);
      auVar30 = vpsrlvd_avx2(auVar30,auVar6);
      auVar30 = vpand_avx(auVar30,auVar38);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar30;
      out = (uint32_t *)((long)out + 0x20);
    }
    break;
  case 0xb:
    auVar6 = vpmovsxbd_avx(ZEXT416(0x1060300));
    auVar20._8_8_ = 0x7ff000007ff;
    auVar20._0_8_ = 0x7ff000007ff;
    auVar12 = vpmovsxbd_avx(ZEXT416(0x5020704));
    lVar11 = 0;
    while (lVar11 != 0xb0) {
      auVar30 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar11),auVar4);
      auVar30 = vpsrlvd_avx2(auVar30,auVar6);
      auVar30 = vpand_avx(auVar30,auVar20);
      *(undefined1 (*) [16])out = auVar30;
      lVar8 = lVar11 + 5;
      lVar11 = lVar11 + 0xb;
      auVar30 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar8),auVar5);
      auVar30 = vpsrlvd_avx2(auVar30,auVar12);
      auVar30 = vpand_avx(auVar30,auVar20);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar30;
      out = (uint32_t *)((long)out + 0x20);
    }
    break;
  case 0xc:
    auVar6 = vpmovsxwd_avx(ZEXT816(0x504040302010100));
    auVar14._8_8_ = 0x400000000;
    auVar14._0_8_ = 0x400000000;
    auVar22._8_8_ = 0xfff00000fff;
    auVar22._0_8_ = 0xfff00000fff;
    lVar11 = 0;
    while (lVar11 != 0xc0) {
      auVar12 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar11),auVar6);
      auVar12 = vpsrlvd_avx2(auVar12,auVar14);
      auVar12 = vpand_avx(auVar12,auVar22);
      *(undefined1 (*) [16])out = auVar12;
      lVar8 = lVar11 + 6;
      lVar11 = lVar11 + 0xc;
      auVar12 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar8),auVar6);
      auVar12 = vpsrlvd_avx2(auVar12,auVar14);
      auVar12 = vpand_avx(auVar12,auVar22);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar12;
      out = (uint32_t *)((long)out + 0x20);
    }
    break;
  case 0xd:
    auVar6 = vpmovsxbd_avx(ZEXT416(0x7020500));
    auVar35._8_8_ = 0x1fff00001fff;
    auVar35._0_8_ = 0x1fff00001fff;
    auVar12 = vpmovsxbd_avx(ZEXT416(0x3060104));
    lVar11 = 0;
    while (lVar11 != 0xd0) {
      auVar30 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar11),auVar37);
      auVar30 = vpsrlvd_avx2(auVar30,auVar6);
      auVar30 = vpand_avx(auVar30,auVar35);
      *(undefined1 (*) [16])out = auVar30;
      lVar8 = lVar11 + 6;
      lVar11 = lVar11 + 0xd;
      auVar30 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar8),auVar31);
      auVar30 = vpsrlvd_avx2(auVar30,auVar12);
      auVar30 = vpand_avx(auVar30,auVar35);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar30;
      out = (uint32_t *)((long)out + 0x20);
    }
    break;
  case 0xe:
    auVar6 = vpmovsxbd_avx(ZEXT416(0x2040600));
    auVar19._8_8_ = 0x3fff00003fff;
    auVar19._0_8_ = 0x3fff00003fff;
    lVar11 = 0;
    while (lVar11 != 0xe0) {
      auVar12 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar11),auVar40);
      auVar12 = vpsrlvd_avx2(auVar12,auVar6);
      auVar12 = vpand_avx(auVar12,auVar19);
      *(undefined1 (*) [16])out = auVar12;
      lVar8 = lVar11 + 7;
      lVar11 = lVar11 + 0xe;
      auVar12 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar8),auVar40);
      auVar12 = vpsrlvd_avx2(auVar12,auVar6);
      auVar12 = vpand_avx(auVar12,auVar19);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar12;
      out = (uint32_t *)((long)out + 0x20);
    }
    break;
  case 0xf:
    auVar6 = vpmovsxbd_avx(ZEXT416(0x5060700));
    auVar27._8_8_ = 0x7fff00007fff;
    auVar27._0_8_ = 0x7fff00007fff;
    auVar12 = vpmovsxbd_avx(ZEXT416(0x1020304));
    lVar11 = 0;
    while (lVar11 != 0xf0) {
      auVar30 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar11),auVar17);
      auVar30 = vpsrlvd_avx2(auVar30,auVar6);
      auVar30 = vpand_avx(auVar30,auVar27);
      *(undefined1 (*) [16])out = auVar30;
      lVar8 = lVar11 + 7;
      lVar11 = lVar11 + 0xf;
      auVar30 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar8),auVar32);
      auVar30 = vpsrlvd_avx2(auVar30,auVar12);
      auVar30 = vpand_avx(auVar30,auVar27);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar30;
      out = (uint32_t *)((long)out + 0x20);
    }
    break;
  case 0x10:
    for (lVar11 = 0; lVar11 != 0x100; lVar11 = lVar11 + 0x10) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *(ulong *)(in + lVar11);
      auVar6 = vpmovzxwd_avx(auVar4);
      *(undefined1 (*) [16])((long)out + lVar11 * 2) = auVar6;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(ulong *)(in + lVar11 + 8);
      auVar6 = vpmovzxwd_avx(auVar5);
      *(undefined1 (*) [16])((long)out + lVar11 * 2 + 0x10) = auVar6;
    }
    break;
  case 0x11:
    lVar11 = 8;
    auVar6 = vpmovsxbd_avx(ZEXT416(0x3020100));
    auVar31._8_8_ = 0x1ffff0001ffff;
    auVar31._0_8_ = 0x1ffff0001ffff;
    auVar12 = vpmovsxbd_avx(ZEXT416(0x7060504));
    while (lVar11 != 0x118) {
      auVar30 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar11 + -8),auVar34);
      auVar30 = vpsrlvd_avx2(auVar30,auVar6);
      auVar30 = vpand_avx(auVar30,auVar31);
      *(undefined1 (*) [16])out = auVar30;
      pauVar1 = (undefined1 (*) [16])(in + lVar11);
      lVar11 = lVar11 + 0x11;
      auVar30 = vpshufb_avx(*pauVar1,auVar34);
      auVar30 = vpsrlvd_avx2(auVar30,auVar12);
      auVar30 = vpand_avx(auVar30,auVar31);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar30;
      out = (uint32_t *)((long)out + 0x20);
    }
    break;
  case 0x12:
    auVar6 = vpmovsxbd_avx(ZEXT416(0x6040200));
    auVar37._8_8_ = 0x3ffff0003ffff;
    auVar37._0_8_ = 0x3ffff0003ffff;
    for (lVar11 = 0; lVar11 != 0x200; lVar11 = lVar11 + 0x20) {
      auVar12 = vpshufb_avx(*(undefined1 (*) [16])in,auVar34);
      auVar12 = vpsrlvd_avx2(auVar12,auVar6);
      auVar12 = vpand_avx(auVar12,auVar37);
      *(undefined1 (*) [16])((long)out + lVar11) = auVar12;
      puVar9 = *(undefined1 (*) [16])in;
      in = *(undefined1 (*) [16])((long)in + 0x10) + 2;
      auVar12 = vpshufb_avx(*(undefined1 (*) [16])(puVar9 + 9),auVar34);
      auVar12 = vpsrlvd_avx2(auVar12,auVar6);
      auVar12 = vpand_avx(auVar12,auVar37);
      *(undefined1 (*) [16])((long)out + lVar11 + 0x10) = auVar12;
    }
    break;
  case 0x13:
    auVar6 = vpmovsxbd_avx(ZEXT416(0x1060300));
    auVar40._8_8_ = 0x7ffff0007ffff;
    auVar40._0_8_ = 0x7ffff0007ffff;
    auVar12 = vpmovsxbd_avx(ZEXT416(0x5020704));
    for (lVar11 = 0; lVar11 != 0x200; lVar11 = lVar11 + 0x20) {
      auVar30 = vpshufb_avx(*(undefined1 (*) [16])in,auVar41);
      auVar30 = vpsrlvd_avx2(auVar30,auVar6);
      auVar30 = vpand_avx(auVar30,auVar40);
      *(undefined1 (*) [16])((long)out + lVar11) = auVar30;
      puVar9 = *(undefined1 (*) [16])in;
      in = *(undefined1 (*) [16])((long)in + 0x10) + 3;
      auVar30 = vpshufb_avx(*(undefined1 (*) [16])(puVar9 + 9),auVar39);
      auVar30 = vpsrlvd_avx2(auVar30,auVar12);
      auVar30 = vpand_avx(auVar30,auVar40);
      *(undefined1 (*) [16])((long)out + lVar11 + 0x10) = auVar30;
    }
    break;
  case 0x14:
    auVar17._8_8_ = 0x400000000;
    auVar17._0_8_ = 0x400000000;
    auVar32._8_8_ = 0xfffff000fffff;
    auVar32._0_8_ = 0xfffff000fffff;
    for (lVar11 = 0; lVar11 != 0x200; lVar11 = lVar11 + 0x20) {
      auVar6 = vpshufb_avx(*(undefined1 (*) [16])in,auVar50);
      auVar6 = vpsrlvd_avx2(auVar6,auVar17);
      auVar6 = vpand_avx(auVar6,auVar32);
      *(undefined1 (*) [16])((long)out + lVar11) = auVar6;
      puVar9 = *(undefined1 (*) [16])in;
      in = *(undefined1 (*) [16])((long)in + 0x10) + 4;
      auVar6 = vpshufb_avx(*(undefined1 (*) [16])(puVar9 + 10),auVar50);
      auVar6 = vpsrlvd_avx2(auVar6,auVar17);
      auVar6 = vpand_avx(auVar6,auVar32);
      *(undefined1 (*) [16])((long)out + lVar11 + 0x10) = auVar6;
    }
    break;
  case 0x15:
    auVar6 = vpmovsxbd_avx(ZEXT416(0x7020500));
    auVar34._8_8_ = 0x1fffff001fffff;
    auVar34._0_8_ = 0x1fffff001fffff;
    auVar12 = vpmovsxbd_avx(ZEXT416(0x3060104));
    for (lVar11 = 0; lVar11 != 0x200; lVar11 = lVar11 + 0x20) {
      auVar30 = vpshufb_avx(*(undefined1 (*) [16])in,auVar43);
      auVar30 = vpsrlvd_avx2(auVar30,auVar6);
      auVar30 = vpand_avx(auVar30,auVar34);
      *(undefined1 (*) [16])((long)out + lVar11) = auVar30;
      puVar9 = *(undefined1 (*) [16])in;
      in = *(undefined1 (*) [16])((long)in + 0x10) + 5;
      auVar30 = vpshufb_avx(*(undefined1 (*) [16])(puVar9 + 10),auVar24);
      auVar30 = vpsrlvd_avx2(auVar30,auVar12);
      auVar30 = vpand_avx(auVar30,auVar34);
      *(undefined1 (*) [16])((long)out + lVar11 + 0x10) = auVar30;
    }
    break;
  case 0x16:
    auVar6 = vpmovsxbd_avx(ZEXT416(0x2040600));
    auVar39._8_8_ = 0x3fffff003fffff;
    auVar39._0_8_ = 0x3fffff003fffff;
    for (lVar11 = 0; lVar11 != 0x200; lVar11 = lVar11 + 0x20) {
      auVar12 = vpshufb_avx(*(undefined1 (*) [16])in,auVar52);
      auVar12 = vpsrlvd_avx2(auVar12,auVar6);
      auVar12 = vpand_avx(auVar12,auVar39);
      *(undefined1 (*) [16])((long)out + lVar11) = auVar12;
      puVar9 = *(undefined1 (*) [16])in;
      in = *(undefined1 (*) [16])((long)in + 0x10) + 6;
      auVar12 = vpshufb_avx(*(undefined1 (*) [16])(puVar9 + 0xb),auVar52);
      auVar12 = vpsrlvd_avx2(auVar12,auVar6);
      auVar12 = vpand_avx(auVar12,auVar39);
      *(undefined1 (*) [16])((long)out + lVar11 + 0x10) = auVar12;
    }
    break;
  case 0x17:
    auVar6 = vpmovsxbd_avx(ZEXT416(0x5060700));
    auVar41._8_8_ = 0x7fffff007fffff;
    auVar41._0_8_ = 0x7fffff007fffff;
    auVar12 = vpmovsxbd_avx(ZEXT416(0x1020304));
    for (lVar11 = 0; lVar11 != 0x200; lVar11 = lVar11 + 0x20) {
      auVar30 = vpshufb_avx(*(undefined1 (*) [16])in,auVar42);
      auVar30 = vpsrlvd_avx2(auVar30,auVar6);
      auVar30 = vpand_avx(auVar30,auVar41);
      *(undefined1 (*) [16])((long)out + lVar11) = auVar30;
      puVar9 = *(undefined1 (*) [16])in;
      in = *(undefined1 (*) [16])((long)in + 0x10) + 7;
      auVar30 = vpshufb_avx(*(undefined1 (*) [16])(puVar9 + 0xb),auVar18);
      auVar30 = vpsrlvd_avx2(auVar30,auVar12);
      auVar30 = vpand_avx(auVar30,auVar41);
      *(undefined1 (*) [16])((long)out + lVar11 + 0x10) = auVar30;
    }
    break;
  case 0x18:
    for (lVar11 = 0; lVar11 != 0x200; lVar11 = lVar11 + 0x20) {
      auVar6 = vpshufb_avx(*(undefined1 (*) [16])in,auVar53);
      *(undefined1 (*) [16])((long)out + lVar11) = auVar6;
      puVar9 = *(undefined1 (*) [16])in;
      in = *(undefined1 (*) [16])((long)in + 0x10) + 8;
      auVar6 = vpshufb_avx(*(undefined1 (*) [16])(puVar9 + 0xc),auVar53);
      *(undefined1 (*) [16])((long)out + lVar11 + 0x10) = auVar6;
    }
    break;
  case 0x19:
    auVar6 = vpmovsxbd_avx(ZEXT416(0x3020100));
    auVar24._8_8_ = 0x1ffffff01ffffff;
    auVar24._0_8_ = 0x1ffffff01ffffff;
    auVar12 = vpmovsxbd_avx(ZEXT416(0x7060504));
    auVar50._8_4_ = 0x1ffffff;
    auVar50._0_8_ = 0x1ffffff01ffffff;
    auVar50._12_4_ = 0x1ffffff;
    for (lVar11 = 0; lVar11 != 0x200; lVar11 = lVar11 + 0x20) {
      auVar30 = vpshufb_avx(*(undefined1 (*) [16])in,auVar48);
      auVar30 = vpsrlvd_avx2(auVar30,auVar6);
      auVar30 = vpand_avx(auVar30,auVar24);
      *(undefined1 (*) [16])((long)out + lVar11) = auVar30;
      puVar9 = *(undefined1 (*) [16])in;
      in = *(undefined1 (*) [16])((long)in + 0x10) + 9;
      auVar30 = vpshufb_avx(*(undefined1 (*) [16])(puVar9 + 0xc),auVar48);
      auVar30 = vpsrlvd_avx2(auVar30,auVar12);
      auVar30 = vpand_avx(auVar30,auVar50);
      *(undefined1 (*) [16])((long)out + lVar11 + 0x10) = auVar30;
    }
    break;
  case 0x1a:
    auVar6 = vpmovsxbd_avx(ZEXT416(0x6040200));
    auVar43._8_4_ = 0x3ffffff;
    auVar43._0_8_ = 0x3ffffff03ffffff;
    auVar43._12_4_ = 0x3ffffff;
    for (lVar11 = 0; lVar11 != 0x200; lVar11 = lVar11 + 0x20) {
      auVar12 = vpshufb_avx(*(undefined1 (*) [16])in,auVar48);
      auVar12 = vpsrlvd_avx2(auVar12,auVar6);
      auVar12 = vpand_avx(auVar12,auVar43);
      *(undefined1 (*) [16])((long)out + lVar11) = auVar12;
      puVar9 = *(undefined1 (*) [16])in;
      in = *(undefined1 (*) [16])((long)in + 0x10) + 10;
      auVar12 = vpshufb_avx(*(undefined1 (*) [16])(puVar9 + 0xd),auVar48);
      auVar12 = vpsrlvd_avx2(auVar12,auVar6);
      auVar12 = vpand_avx(auVar12,auVar43);
      *(undefined1 (*) [16])((long)out + lVar11 + 0x10) = auVar12;
    }
    break;
  case 0x1b:
    auVar6 = vpmovsxbd_avx(ZEXT416(0x1000300));
    auVar18._8_8_ = 0x7ffffff07ffffff;
    auVar18._0_8_ = 0x7ffffff07ffffff;
    auVar12 = vpmovsxbd_avx(ZEXT416(0x5020004));
    auVar52._8_4_ = 0x7ffffff;
    auVar52._0_8_ = 0x7ffffff07ffffff;
    auVar52._12_4_ = 0x7ffffff;
    for (lVar11 = 0; lVar11 != 0x200; lVar11 = lVar11 + 0x20) {
      auVar48 = vpshufb_avx(*(undefined1 (*) [16])in,auVar30);
      auVar53 = vpsrlq_avx(auVar48,6);
      auVar48 = vpblendd_avx2(auVar48,auVar53,4);
      auVar48 = vpsrlvd_avx2(auVar48,auVar6);
      auVar48 = vpand_avx(auVar48,auVar18);
      *(undefined1 (*) [16])((long)out + lVar11) = auVar48;
      auVar48 = *(undefined1 (*) [16])(*(undefined1 (*) [16])in + 0xd);
      in = *(undefined1 (*) [16])((long)in + 0x10) + 0xb;
      auVar53 = vpaddq_avx(auVar48,auVar48);
      auVar48 = vpermt2b_avx512vl(auVar48,auVar47,auVar53);
      auVar48 = vpsrlvd_avx2(auVar48,auVar12);
      auVar48 = vpand_avx(auVar48,auVar52);
      *(undefined1 (*) [16])((long)out + lVar11 + 0x10) = auVar48;
    }
    break;
  case 0x1c:
    auVar53._8_8_ = 0x400000000;
    auVar53._0_8_ = 0x400000000;
    auVar42._8_4_ = 0xfffffff;
    auVar42._0_8_ = 0xfffffff0fffffff;
    auVar42._12_4_ = 0xfffffff;
    for (lVar11 = 0; lVar11 != 0x200; lVar11 = lVar11 + 0x20) {
      auVar6 = vpshufb_avx(*(undefined1 (*) [16])in,auVar12);
      auVar6 = vpsrlvd_avx2(auVar6,auVar53);
      auVar6 = vpand_avx(auVar6,auVar42);
      *(undefined1 (*) [16])((long)out + lVar11) = auVar6;
      puVar9 = *(undefined1 (*) [16])in;
      in = *(undefined1 (*) [16])((long)in + 0x10) + 0xc;
      auVar6 = vpshufb_avx(*(undefined1 (*) [16])(puVar9 + 0xe),auVar12);
      auVar6 = vpsrlvd_avx2(auVar6,auVar53);
      auVar6 = vpand_avx(auVar6,auVar42);
      *(undefined1 (*) [16])((long)out + lVar11 + 0x10) = auVar6;
    }
    break;
  case 0x1d:
    auVar6 = vpmovsxbd_avx(ZEXT416(0x2020000));
    auVar44 = ZEXT1664(auVar6);
    auVar49 = ZEXT1664(CONCAT88(0x1fffffff1fffffff,0x1fffffff1fffffff));
    auVar51 = ZEXT1664(_DAT_001541f0);
    auVar6 = vpmovsxbd_avx(ZEXT416(0x3020100));
    auVar54 = ZEXT1664(auVar6);
    auVar55 = ZEXT1664(CONCAT412(0x1fffffff,CONCAT48(0x1fffffff,0x1fffffff1fffffff)));
    for (lVar11 = 0; lVar11 != 0x200; lVar11 = lVar11 + 0x20) {
      auVar6 = *(undefined1 (*) [16])in;
      if (simdhunpack29(unsigned_char_const*,unsigned_int*)::x2 == '\0') {
        iVar10 = __cxa_guard_acquire(&simdhunpack29(unsigned_char_const*,unsigned_int*)::x2);
        auVar55 = ZEXT1664(CONCAT412(0x1fffffff,CONCAT48(0x1fffffff,0x1fffffff1fffffff)));
        auVar12 = vpmovsxbd_avx(ZEXT416(0x3020100));
        auVar54 = ZEXT1664(auVar12);
        auVar51 = ZEXT1664(_DAT_001541f0);
        auVar49 = ZEXT1664(CONCAT88(0x1fffffff1fffffff,0x1fffffff1fffffff));
        auVar12 = vpmovsxbd_avx(ZEXT416(0x2020000));
        auVar44 = ZEXT1664(auVar12);
        if (iVar10 != 0) {
          simdhunpack29(unsigned_char_const*,unsigned_int*)::x2._0_8_ = 0x706050403020100;
          simdhunpack29(unsigned_char_const*,unsigned_int*)::x2._8_8_ = 0xe0d0c0b0a090807;
          __cxa_guard_release(&simdhunpack29(unsigned_char_const*,unsigned_int*)::x2);
          auVar55 = ZEXT1664(CONCAT412(0x1fffffff,CONCAT48(0x1fffffff,0x1fffffff1fffffff)));
          auVar12 = vpmovsxbd_avx(ZEXT416(0x3020100));
          auVar54 = ZEXT1664(auVar12);
          auVar51 = ZEXT1664(_DAT_001541f0);
          auVar49 = ZEXT1664(CONCAT88(0x1fffffff1fffffff,0x1fffffff1fffffff));
          auVar12 = vpmovsxbd_avx(ZEXT416(0x2020000));
          auVar44 = ZEXT1664(auVar12);
        }
      }
      auVar12 = vpsllq_avx(auVar6,3);
      auVar12 = vpblendw_avx(auVar12,auVar6,0x13);
      auVar47._8_8_ = simdhunpack29(unsigned_char_const*,unsigned_int*)::x2._8_8_;
      auVar47._0_8_ = simdhunpack29(unsigned_char_const*,unsigned_int*)::x2._0_8_;
      auVar12 = vpshufb_avx(auVar12,auVar47);
      if (simdhunpack29(unsigned_char_const*,unsigned_int*)::x1 == '\0') {
        iVar10 = __cxa_guard_acquire(&simdhunpack29(unsigned_char_const*,unsigned_int*)::x1);
        auVar55 = ZEXT1664(CONCAT412(0x1fffffff,CONCAT48(0x1fffffff,0x1fffffff1fffffff)));
        auVar30 = vpmovsxbd_avx(ZEXT416(0x3020100));
        auVar54 = ZEXT1664(auVar30);
        auVar51 = ZEXT1664(_DAT_001541f0);
        auVar49 = ZEXT1664(CONCAT88(0x1fffffff1fffffff,0x1fffffff1fffffff));
        auVar30 = vpmovsxbd_avx(ZEXT416(0x2020000));
        auVar44 = ZEXT1664(auVar30);
        if (iVar10 != 0) {
          simdhunpack29(unsigned_char_const*,unsigned_int*)::x1._0_8_ = 0x706050403020100;
          simdhunpack29(unsigned_char_const*,unsigned_int*)::x1._8_8_ = 0xe0d0c0b0a090807;
          __cxa_guard_release(&simdhunpack29(unsigned_char_const*,unsigned_int*)::x1);
          auVar55 = ZEXT1664(CONCAT412(0x1fffffff,CONCAT48(0x1fffffff,0x1fffffff1fffffff)));
          auVar30 = vpmovsxbd_avx(ZEXT416(0x3020100));
          auVar54 = ZEXT1664(auVar30);
          auVar51 = ZEXT1664(_DAT_001541f0);
          auVar49 = ZEXT1664(CONCAT88(0x1fffffff1fffffff,0x1fffffff1fffffff));
          auVar30 = vpmovsxbd_avx(ZEXT416(0x2020000));
          auVar44 = ZEXT1664(auVar30);
        }
      }
      auVar48._8_8_ = simdhunpack29(unsigned_char_const*,unsigned_int*)::x1._8_8_;
      auVar48._0_8_ = simdhunpack29(unsigned_char_const*,unsigned_int*)::x1._0_8_;
      auVar6 = vpshufb_avx(auVar6,auVar48);
      auVar6 = vpblendd_avx2(auVar6,auVar12,10);
      auVar6 = vpsrlvd_avx2(auVar6,auVar44._0_16_);
      auVar6 = vpand_avx(auVar6,auVar49._0_16_);
      *(undefined1 (*) [16])((long)out + lVar11) = auVar6;
      puVar9 = *(undefined1 (*) [16])in;
      in = *(undefined1 (*) [16])((long)in + 0x10) + 0xd;
      auVar6 = vpshufb_avx(*(undefined1 (*) [16])(puVar9 + 0xe),auVar51._0_16_);
      auVar12 = vpsrlq_avx(auVar6,4);
      auVar6 = vpblendd_avx2(auVar12,auVar6,10);
      auVar6 = vpsrlvd_avx2(auVar6,auVar54._0_16_);
      auVar6 = vpand_avx(auVar6,auVar55._0_16_);
      *(undefined1 (*) [16])((long)out + lVar11 + 0x10) = auVar6;
    }
    break;
  case 0x1e:
    auVar12._8_8_ = 0x200000000;
    auVar12._0_8_ = 0x200000000;
    auVar30._8_4_ = 0x3fffffff;
    auVar30._0_8_ = 0x3fffffff3fffffff;
    auVar30._12_4_ = 0x3fffffff;
    for (lVar11 = 0; lVar11 != 0x200; lVar11 = lVar11 + 0x20) {
      auVar47 = vpshufb_avx(*(undefined1 (*) [16])in,auVar6);
      auVar48 = vpsllq_avx(*(undefined1 (*) [16])in,4);
      auVar53 = vpsrlq_avx(auVar47,4);
      auVar47 = vpblendd_avx2(auVar47,auVar53,4);
      auVar47 = vpblendd_avx2(auVar47,auVar48,2);
      auVar47 = vpsrlvd_avx2(auVar47,auVar12);
      auVar47 = vpand_avx(auVar47,auVar30);
      *(undefined1 (*) [16])((long)out + lVar11) = auVar47;
      puVar9 = *(undefined1 (*) [16])in;
      in = *(undefined1 (*) [16])((long)in + 0x10) + 0xe;
      auVar47 = vpshufb_avx(*(undefined1 (*) [16])(puVar9 + 0xf),auVar6);
      auVar48 = vpsllq_avx(*(undefined1 (*) [16])(puVar9 + 0xf),4);
      auVar53 = vpsrlq_avx(auVar47,4);
      auVar47 = vpblendd_avx2(auVar47,auVar53,4);
      auVar47 = vpblendd_avx2(auVar47,auVar48,2);
      auVar47 = vpsrlvd_avx2(auVar47,auVar12);
      auVar47 = vpand_avx(auVar47,auVar30);
      *(undefined1 (*) [16])((long)out + lVar11 + 0x10) = auVar47;
    }
    break;
  case 0x1f:
    if ((simdhunpack31(unsigned_char_const*,unsigned_int*)::mask == '\0') &&
       (iVar10 = __cxa_guard_acquire(&simdhunpack31(unsigned_char_const*,unsigned_int*)::mask),
       iVar10 != 0)) {
      simdhunpack31(unsigned_char_const*,unsigned_int*)::mask._0_8_ = 0x7fffffff7fffffff;
      simdhunpack31(unsigned_char_const*,unsigned_int*)::mask._8_8_ = 0x7fffffff7fffffff;
      __cxa_guard_release(&simdhunpack31(unsigned_char_const*,unsigned_int*)::mask);
    }
    auVar6._8_8_ = simdhunpack31(unsigned_char_const*,unsigned_int*)::mask._8_8_;
    auVar6._0_8_ = simdhunpack31(unsigned_char_const*,unsigned_int*)::mask._0_8_;
    for (lVar11 = 0; lVar11 != 0x200; lVar11 = lVar11 + 0x20) {
      auVar12 = *(undefined1 (*) [16])in;
      auVar30 = vpaddq_avx(auVar12,auVar12);
      auVar47 = vpslldq_avx(auVar12,1);
      auVar30 = vpblendd_avx2(auVar12,auVar30,2);
      auVar48 = vpsrlq_avx(auVar47,6);
      auVar47 = vpsllq_avx(auVar12,3);
      auVar12 = vpblendd_avx2(auVar30,auVar48,0xc);
      auVar12 = vpblendd_avx2(auVar12,auVar47,8);
      auVar12 = vpand_avx(auVar6,auVar12);
      *(undefined1 (*) [16])((long)out + lVar11) = auVar12;
      auVar12 = *(undefined1 (*) [16])(*(undefined1 (*) [16])in + 0xf);
      in = *(undefined1 (*) [16])((long)in + 0x10) + 0xf;
      auVar47 = vpsrldq_avx(auVar12,1);
      auVar30 = vpsrlq_avx(auVar12,4);
      auVar47 = vpsllq_avx(auVar47,5);
      auVar30 = vpblendd_avx2(auVar30,auVar47,2);
      auVar48 = vpsrlq_avx(auVar12,2);
      auVar47 = vpsrlq_avx(auVar12,1);
      auVar12 = vpblendd_avx2(auVar30,auVar48,0xc);
      auVar12 = vpblendd_avx2(auVar12,auVar47,8);
      auVar12 = vpand_avx(auVar6,auVar12);
      *(undefined1 (*) [16])((long)out + lVar11 + 0x10) = auVar12;
    }
    break;
  case 0x20:
    for (lVar11 = 0; lVar11 != 0x200; lVar11 = lVar11 + 0x20) {
      uVar7 = *(undefined8 *)(in + lVar11 + 8);
      *(undefined8 *)((long)out + lVar11) = *(undefined8 *)(in + lVar11);
      ((undefined8 *)((long)out + lVar11))[1] = uVar7;
      uVar7 = *(undefined8 *)(in + lVar11 + 0x10 + 8);
      puVar2 = (undefined8 *)((long)out + lVar11 + 0x10);
      *puVar2 = *(undefined8 *)(in + lVar11 + 0x10);
      puVar2[1] = uVar7;
    }
    break;
  default:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"number of bits is unsupported");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void simdhunpack(const uint8_t *in, uint32_t *out, uint32_t bit) {
  switch (bit) {
  case 0:
    SIMD_nullunpacker32(in, out);
    return;

  case 1:
    simdhunpack1(in, out);
    return;

  case 2:
    simdhunpack2(in, out);
    return;

  case 3:
    simdhunpack3(in, out);
    return;

  case 4:
    simdhunpack4(in, out);
    return;

  case 5:
    simdhunpack5(in, out);
    return;

  case 6:
    simdhunpack6(in, out);
    return;

  case 7:
    simdhunpack7(in, out);
    return;

  case 8:
    simdhunpack8(in, out);
    return;

  case 9:
    simdhunpack9(in, out);
    return;

  case 10:
    simdhunpack10(in, out);
    return;

  case 11:
    simdhunpack11(in, out);
    return;

  case 12:
    simdhunpack12(in, out);
    return;

  case 13:
    simdhunpack13(in, out);
    return;

  case 14:
    simdhunpack14(in, out);
    return;

  case 15:
    simdhunpack15(in, out);
    return;

  case 16:
    simdhunpack16(in, out);
    return;

  case 17:
    simdhunpack17(in, out);
    return;

  case 18:
    simdhunpack18(in, out);
    return;

  case 19:
    simdhunpack19(in, out);
    return;

  case 20:
    simdhunpack20(in, out);
    return;

  case 21:
    simdhunpack21(in, out);
    return;

  case 22:
    simdhunpack22(in, out);
    return;

  case 23:
    simdhunpack23(in, out);
    return;

  case 24:
    simdhunpack24(in, out);
    return;

  case 25:
    simdhunpack25(in, out);
    return;

  case 26:
    simdhunpack26(in, out);
    return;

  case 27:
    simdhunpack27(in, out);
    return;

  case 28:
    simdhunpack28(in, out);
    return;

  case 29:
    simdhunpack29(in, out);
    return;

  case 30:
    simdhunpack30(in, out);
    return;

  case 31:
    simdhunpack31(in, out);
    return;

  case 32:
    simdhunpack32(in, out);
    return;

  default:
    break;
  }
  throw std::logic_error("number of bits is unsupported");
}